

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O0

int amqp_field_value_clone(amqp_field_value_t *original,amqp_field_value_t *clone,amqp_pool_t *pool)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  amqp_pool_t *pool_00;
  amqp_field_value_t *in_RDX;
  amqp_field_value_t *in_RSI;
  uint8_t *in_RDI;
  int res;
  int i;
  amqp_pool_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  in_RSI->kind = *in_RDI;
  pool_00 = (amqp_pool_t *)(ulong)(in_RSI->kind - 0x41);
  switch(pool_00) {
  case (amqp_pool_t *)0x0:
    if (*(long *)(in_RDI + 0x10) == 0) {
      (in_RSI->value).i64 = 0;
      (in_RSI->value).array.entries = (amqp_field_value_t_ *)0x0;
    }
    else {
      (in_RSI->value).boolean = *(amqp_boolean_t *)(in_RDI + 8);
      pvVar3 = amqp_pool_alloc((amqp_pool_t *)
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                               (size_t)pool_00);
      (in_RSI->value).bytes.bytes = pvVar3;
      if ((in_RSI->value).bytes.bytes == (void *)0x0) {
        return -1;
      }
      for (iVar2 = 0; iVar2 < (in_RSI->value).boolean; iVar2 = iVar2 + 1) {
        iVar1 = amqp_field_value_clone
                          (in_RSI,in_RDX,(amqp_pool_t *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
        if (iVar1 != 0) {
          return iVar1;
        }
        in_stack_ffffffffffffffd8 = 0;
      }
    }
    break;
  case (amqp_pool_t *)0x1:
    (in_RSI->value).i8 = in_RDI[8];
    break;
  default:
    return -10;
  case (amqp_pool_t *)0x3:
    (in_RSI->value).i64 = *(int64_t *)(in_RDI + 8);
    break;
  case (amqp_pool_t *)0x5:
    iVar2 = amqp_table_clone((amqp_table_t *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                             (amqp_table_t *)pool_00,in_stack_ffffffffffffffc8);
    return iVar2;
  case (amqp_pool_t *)0x8:
    (in_RSI->value).boolean = *(amqp_boolean_t *)(in_RDI + 8);
    break;
  case (amqp_pool_t *)0xb:
  case (amqp_pool_t *)0x13:
    (in_RSI->value).i64 = *(int64_t *)(in_RDI + 8);
    break;
  case (amqp_pool_t *)0x12:
  case (amqp_pool_t *)0x37:
    if (*(long *)(in_RDI + 8) == 0) {
      (in_RSI->value).bytes.len = 0;
      (in_RSI->value).bytes.bytes = (void *)0x0;
    }
    else {
      amqp_pool_alloc_bytes(pool_00,(size_t)in_stack_ffffffffffffffc8,(amqp_bytes_t *)0x117405);
      if ((in_RSI->value).bytes.bytes == (void *)0x0) {
        return -1;
      }
      memcpy((in_RSI->value).bytes.bytes,*(void **)(in_RDI + 0x10),(in_RSI->value).u64);
    }
    break;
  case (amqp_pool_t *)0x15:
    break;
  case (amqp_pool_t *)0x21:
    (in_RSI->value).i8 = in_RDI[8];
    break;
  case (amqp_pool_t *)0x23:
    (in_RSI->value).i64 = *(int64_t *)(in_RDI + 8);
    break;
  case (amqp_pool_t *)0x25:
    (in_RSI->value).boolean = *(amqp_boolean_t *)(in_RDI + 8);
    break;
  case (amqp_pool_t *)0x28:
    (in_RSI->value).boolean = *(amqp_boolean_t *)(in_RDI + 8);
    break;
  case (amqp_pool_t *)0x2b:
    (in_RSI->value).i64 = *(int64_t *)(in_RDI + 8);
    break;
  case (amqp_pool_t *)0x32:
    (in_RSI->value).i16 = *(int16_t *)(in_RDI + 8);
    break;
  case (amqp_pool_t *)0x33:
    (in_RSI->value).boolean = *(amqp_boolean_t *)(in_RDI + 8);
    break;
  case (amqp_pool_t *)0x34:
    (in_RSI->value).i16 = *(int16_t *)(in_RDI + 8);
  }
  return 0;
}

Assistant:

static int amqp_field_value_clone(const amqp_field_value_t *original,
                                  amqp_field_value_t *clone,
                                  amqp_pool_t *pool) {
  int i;
  int res;
  clone->kind = original->kind;

  switch (clone->kind) {
    case AMQP_FIELD_KIND_BOOLEAN:
      clone->value.boolean = original->value.boolean;
      break;

    case AMQP_FIELD_KIND_I8:
      clone->value.i8 = original->value.i8;
      break;

    case AMQP_FIELD_KIND_U8:
      clone->value.u8 = original->value.u8;
      break;

    case AMQP_FIELD_KIND_I16:
      clone->value.i16 = original->value.i16;
      break;

    case AMQP_FIELD_KIND_U16:
      clone->value.u16 = original->value.u16;
      break;

    case AMQP_FIELD_KIND_I32:
      clone->value.i32 = original->value.i32;
      break;

    case AMQP_FIELD_KIND_U32:
      clone->value.u32 = original->value.u32;
      break;

    case AMQP_FIELD_KIND_I64:
      clone->value.i64 = original->value.i64;
      break;

    case AMQP_FIELD_KIND_U64:
    case AMQP_FIELD_KIND_TIMESTAMP:
      clone->value.u64 = original->value.u64;
      break;

    case AMQP_FIELD_KIND_F32:
      clone->value.f32 = original->value.f32;
      break;

    case AMQP_FIELD_KIND_F64:
      clone->value.f64 = original->value.f64;
      break;

    case AMQP_FIELD_KIND_DECIMAL:
      clone->value.decimal = original->value.decimal;
      break;

    case AMQP_FIELD_KIND_UTF8:
    case AMQP_FIELD_KIND_BYTES:
      if (0 == original->value.bytes.len) {
        clone->value.bytes = amqp_empty_bytes;
      } else {
        amqp_pool_alloc_bytes(pool, original->value.bytes.len,
                              &clone->value.bytes);
        if (NULL == clone->value.bytes.bytes) {
          return AMQP_STATUS_NO_MEMORY;
        }
        memcpy(clone->value.bytes.bytes, original->value.bytes.bytes,
               clone->value.bytes.len);
      }
      break;

    case AMQP_FIELD_KIND_ARRAY:
      if (0 == original->value.array.entries) {
        clone->value.array = amqp_empty_array;
      } else {
        clone->value.array.num_entries = original->value.array.num_entries;
        clone->value.array.entries = amqp_pool_alloc(
            pool, clone->value.array.num_entries * sizeof(amqp_field_value_t));
        if (NULL == clone->value.array.entries) {
          return AMQP_STATUS_NO_MEMORY;
        }

        for (i = 0; i < clone->value.array.num_entries; ++i) {
          res = amqp_field_value_clone(&original->value.array.entries[i],
                                       &clone->value.array.entries[i], pool);
          if (AMQP_STATUS_OK != res) {
            return res;
          }
        }
      }
      break;

    case AMQP_FIELD_KIND_TABLE:
      return amqp_table_clone(&original->value.table, &clone->value.table,
                              pool);

    case AMQP_FIELD_KIND_VOID:
      break;

    default:
      return AMQP_STATUS_INVALID_PARAMETER;
  }

  return AMQP_STATUS_OK;
}